

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

int Nwk_ObjLevelNew(Nwk_Obj_t *pObj)

{
  int iVar1;
  Tim_Man_t *p;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  p = pObj->pMan->pManTime;
  uVar5 = *(uint *)&pObj->field_0x20;
  uVar3 = uVar5 & 7;
  if ((uVar3 == 4) || (uVar3 == 1)) {
    iVar8 = 0;
    if ((p != (Tim_Man_t *)0x0) && (iVar4 = Tim_ManBoxForCi(p,uVar5 >> 7), iVar8 = 0, -1 < iVar4)) {
      uVar5 = Tim_ManBoxInputFirst(p,iVar4);
      uVar3 = Tim_ManBoxInputNum(p,iVar4);
      if ((int)uVar3 < 1) {
        iVar8 = 1;
      }
      else {
        pVVar2 = pObj->pMan->vCos;
        uVar7 = (ulong)uVar5;
        uVar6 = (ulong)uVar3;
        iVar8 = 0;
        do {
          if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar4 = *(int *)((long)pVVar2->pArray[uVar7] + 0x2c);
          if (iVar8 <= iVar4) {
            iVar8 = iVar4;
          }
          uVar7 = uVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        iVar8 = iVar8 + 1;
      }
    }
  }
  else {
    if ((uVar5 & 6) != 2) {
      __assert_fail("Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                    ,0x2ed,"int Nwk_ObjLevelNew(Nwk_Obj_t *)");
    }
    iVar4 = pObj->nFanins;
    if ((long)iVar4 < 1) {
      iVar8 = 0;
    }
    else {
      lVar9 = 0;
      iVar8 = 0;
      do {
        if (pObj->pFanio[lVar9] == (Nwk_Obj_t *)0x0) break;
        iVar1 = pObj->pFanio[lVar9]->Level;
        if (iVar8 <= iVar1) {
          iVar8 = iVar1;
        }
        lVar9 = lVar9 + 1;
      } while (iVar4 != lVar9);
    }
    iVar8 = (uint)(0 < iVar4 && uVar3 == 3) + iVar8;
  }
  return iVar8;
}

Assistant:

int Nwk_ObjLevelNew( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Nwk_Obj_t * pFanin;
    int i, iBox, iTerm1, nTerms, Level = 0;
    if ( Nwk_ObjIsCi(pObj) || Nwk_ObjIsLatch(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this CI is an output of the box
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pFanin = Nwk_ManCo(pObj->pMan, iTerm1 + i);
                    Level = Abc_MaxInt( Level, Nwk_ObjLevel(pFanin) );
                }
                Level++;
            }
        }
        return Level;
    }
    assert( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) );
    Nwk_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxInt( Level, Nwk_ObjLevel(pFanin) );
    return Level + (Nwk_ObjIsNode(pObj) && Nwk_ObjFaninNum(pObj) > 0);
}